

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::date_format<char>::do_parse<double>
          (date_format<char> *this,string_type *str,double *value)

{
  int32_t iVar1;
  icu_std_converter<char,_1> *this_00;
  char_type *pcVar2;
  UnicodeString *str_00;
  double *in_RDX;
  char_type *in_RDI;
  char_type *pcVar3;
  double n;
  double dVar4;
  double dVar5;
  size_t cut;
  double date;
  UDate udate;
  UnicodeString tmp;
  ParsePosition pp;
  ParsePosition *in_stack_ffffffffffffff00;
  double from_u;
  char_type *in_stack_ffffffffffffff60;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff68;
  ParsePosition local_70 [64];
  ParsePosition local_30 [16];
  double *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  icu_70::ParsePosition::ParsePosition(in_stack_ffffffffffffff00);
  this_00 = (icu_std_converter<char,_1> *)(in_RDI + 8);
  pcVar2 = (char_type *)std::__cxx11::string::data();
  str_00 = (UnicodeString *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  icu_std_converter<char,_1>::icu(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,pcVar2);
  pcVar3 = (char_type *)icu_70::DateFormat::parse(*(UnicodeString **)(in_RDI + 0x40),local_70);
  pcVar2 = pcVar3;
  iVar1 = icu_70::ParsePosition::getIndex(local_30);
  if (iVar1 == 0) {
    local_8 = 0;
  }
  else {
    n = (double)pcVar3 / 1000.0;
    from_u = n;
    dVar4 = std::numeric_limits<double>::max();
    if (n <= dVar4) {
      dVar4 = from_u;
      dVar5 = std::numeric_limits<double>::min();
      if (dVar5 <= from_u) {
        std::__cxx11::string::data();
        std::__cxx11::string::data();
        std::__cxx11::string::size();
        icu_70::ParsePosition::getIndex(local_30);
        local_8 = icu_std_converter<char,_1>::cut
                            (this_00,str_00,in_RDI,pcVar2,(size_t)n,(size_t)from_u,
                             (size_t)in_stack_ffffffffffffff60);
        if (local_8 == 0) {
          local_8 = 0;
        }
        else {
          *local_20 = dVar4;
        }
        goto LAB_0026ccd9;
      }
    }
    local_8 = 0;
  }
LAB_0026ccd9:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_70);
  icu_70::ParsePosition::~ParsePosition(local_30);
  return local_8;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &value) const
            {
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data() + str.size());

                UDate udate = icu_fmt_->parse(tmp,pp);
                if(pp.getIndex() == 0)
                    return 0;
                double date = udate / 1000.0;
                typedef std::numeric_limits<ValueType> limits_type;
                if(date > limits_type::max() || date < limits_type::min())
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                value=static_cast<ValueType>(date);
                return cut;

            }